

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_def.c
# Opt level: O2

int count_exts_in_msg(google_protobuf_DescriptorProto *msg_proto)

{
  int iVar1;
  upb_Array *puVar2;
  int iVar3;
  size_t i;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  
  puVar2 = upb_Message_GetArray
                     (&msg_proto->base_dont_copy_me__upb_internal_use_only,
                      (upb_MiniTableField *)&DAT_00368ea4);
  if (puVar2 == (upb_Array *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = (int)puVar2->size_dont_copy_me__upb_internal_use_only;
  }
  puVar2 = upb_Message_GetArray
                     (&msg_proto->base_dont_copy_me__upb_internal_use_only,
                      (upb_MiniTableField *)&DAT_00368eb0);
  if (puVar2 == (upb_Array *)0x0) {
    sVar5 = 0;
    uVar6 = 0;
  }
  else {
    sVar5 = puVar2->size_dont_copy_me__upb_internal_use_only;
    uVar6 = puVar2->data_dont_copy_me__upb_internal_use_only & 0xfffffffffffffff8;
  }
  for (sVar4 = 0; sVar5 != sVar4; sVar4 = sVar4 + 1) {
    iVar1 = count_exts_in_msg(*(google_protobuf_DescriptorProto **)(uVar6 + sVar4 * 8));
    iVar3 = iVar3 + iVar1;
  }
  return iVar3;
}

Assistant:

static int count_exts_in_msg(const UPB_DESC(DescriptorProto) * msg_proto) {
  size_t n;
  UPB_DESC(DescriptorProto_extension)(msg_proto, &n);
  int ext_count = n;

  const UPB_DESC(DescriptorProto)* const* nested_msgs =
      UPB_DESC(DescriptorProto_nested_type)(msg_proto, &n);
  for (size_t i = 0; i < n; i++) {
    ext_count += count_exts_in_msg(nested_msgs[i]);
  }

  return ext_count;
}